

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

Limit __thiscall
google::protobuf::io::CodedInputStream::ReadLengthAndPushLimit(CodedInputStream *this)

{
  Limit LVar1;
  CodedInputStream *in_RDI;
  uint32 length;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  ReadVarint32(in_RDI,(uint32 *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  LVar1 = PushLimit((CodedInputStream *)
                    CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                    (int)((ulong)in_RDI >> 0x20));
  return LVar1;
}

Assistant:

CodedInputStream::Limit CodedInputStream::ReadLengthAndPushLimit() {
  uint32 length;
  return PushLimit(ReadVarint32(&length) ? length : 0);
}